

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O0

int lys_ext_instance_presence(lys_ext *def,lys_ext_instance **ext,uint8_t ext_size)

{
  char *s1;
  int iVar1;
  lys_module *plVar2;
  byte local_22;
  uint8_t index;
  uint8_t ext_size_local;
  lys_ext_instance **ext_local;
  lys_ext *def_local;
  
  if ((def == (lys_ext *)0x0) || ((ext_size != '\0' && (ext == (lys_ext_instance **)0x0)))) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_ext_instance_presence")
    ;
  }
  else {
    for (local_22 = 0; local_22 < ext_size; local_22 = local_22 + 1) {
      if (ext[local_22]->module->ctx == def->module->ctx) {
        if (ext[local_22]->def == def) {
          return (uint)local_22;
        }
      }
      else {
        iVar1 = ly_strequal_(ext[local_22]->def->name,def->name);
        if (iVar1 != 0) {
          plVar2 = lys_main_module(ext[local_22]->def->module);
          s1 = plVar2->name;
          plVar2 = lys_main_module(def->module);
          iVar1 = ly_strequal_(s1,plVar2->name);
          if (iVar1 != 0) {
            return (uint)local_22;
          }
        }
      }
    }
  }
  return -1;
}

Assistant:

API int
lys_ext_instance_presence(struct lys_ext *def, struct lys_ext_instance **ext, uint8_t ext_size)
{
    uint8_t index;

    if (!def || (ext_size && !ext)) {
        LOGARG;
        return -1;
    }

    /* search for the extension instance */
    for (index = 0; index < ext_size; index++) {
        if (ext[index]->module->ctx == def->module->ctx) {
            /* from the same context */
            if (ext[index]->def == def) {
                return index;
            }
        } else {
            /* from different contexts */
            if (ly_strequal0(ext[index]->def->name, def->name)
                    && ly_strequal0(lys_main_module(ext[index]->def->module)->name, lys_main_module(def->module)->name)) {
                return index;
            }
        }
    }

    /* not found */
    return -1;
}